

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

char * idToVersion(PolicyID id)

{
  char *pcStack_10;
  PolicyID id_local;
  
  switch(id) {
  case CMP0000:
    pcStack_10 = "2.6.0";
    break;
  case CMP0001:
    pcStack_10 = "2.6.0";
    break;
  case CMP0002:
    pcStack_10 = "2.6.0";
    break;
  case CMP0003:
    pcStack_10 = "2.6.0";
    break;
  case CMP0004:
    pcStack_10 = "2.6.0";
    break;
  case CMP0005:
    pcStack_10 = "2.6.0";
    break;
  case CMP0006:
    pcStack_10 = "2.6.0";
    break;
  case CMP0007:
    pcStack_10 = "2.6.0";
    break;
  case CMP0008:
    pcStack_10 = "2.6.1";
    break;
  case CMP0009:
    pcStack_10 = "2.6.2";
    break;
  case CMP0010:
    pcStack_10 = "2.6.3";
    break;
  case CMP0011:
    pcStack_10 = "2.6.3";
    break;
  case CMP0012:
    pcStack_10 = "2.8.0";
    break;
  case CMP0013:
    pcStack_10 = "2.8.0";
    break;
  case CMP0014:
    pcStack_10 = "2.8.0";
    break;
  case CMP0015:
    pcStack_10 = "2.8.1";
    break;
  case CMP0016:
    pcStack_10 = "2.8.3";
    break;
  case CMP0017:
    pcStack_10 = "2.8.4";
    break;
  case CMP0018:
    pcStack_10 = "2.8.9";
    break;
  case CMP0019:
    pcStack_10 = "2.8.11";
    break;
  case CMP0020:
    pcStack_10 = "2.8.11";
    break;
  case CMP0021:
    pcStack_10 = "2.8.12";
    break;
  case CMP0022:
    pcStack_10 = "2.8.12";
    break;
  case CMP0023:
    pcStack_10 = "2.8.12";
    break;
  case CMP0024:
    pcStack_10 = "3.0.0";
    break;
  case CMP0025:
    pcStack_10 = "3.0.0";
    break;
  case CMP0026:
    pcStack_10 = "3.0.0";
    break;
  case CMP0027:
    pcStack_10 = "3.0.0";
    break;
  case CMP0028:
    pcStack_10 = "3.0.0";
    break;
  case CMP0029:
    pcStack_10 = "3.0.0";
    break;
  case CMP0030:
    pcStack_10 = "3.0.0";
    break;
  case CMP0031:
    pcStack_10 = "3.0.0";
    break;
  case CMP0032:
    pcStack_10 = "3.0.0";
    break;
  case CMP0033:
    pcStack_10 = "3.0.0";
    break;
  case CMP0034:
    pcStack_10 = "3.0.0";
    break;
  case CMP0035:
    pcStack_10 = "3.0.0";
    break;
  case CMP0036:
    pcStack_10 = "3.0.0";
    break;
  case CMP0037:
    pcStack_10 = "3.0.0";
    break;
  case CMP0038:
    pcStack_10 = "3.0.0";
    break;
  case CMP0039:
    pcStack_10 = "3.0.0";
    break;
  case CMP0040:
    pcStack_10 = "3.0.0";
    break;
  case CMP0041:
    pcStack_10 = "3.0.0";
    break;
  case CMP0042:
    pcStack_10 = "3.0.0";
    break;
  case CMP0043:
    pcStack_10 = "3.0.0";
    break;
  case CMP0044:
    pcStack_10 = "3.0.0";
    break;
  case CMP0045:
    pcStack_10 = "3.0.0";
    break;
  case CMP0046:
    pcStack_10 = "3.0.0";
    break;
  case CMP0047:
    pcStack_10 = "3.0.0";
    break;
  case CMP0048:
    pcStack_10 = "3.0.0";
    break;
  case CMP0049:
    pcStack_10 = "3.0.0";
    break;
  case CMP0050:
    pcStack_10 = "3.0.0";
    break;
  case CMP0051:
    pcStack_10 = "3.1.0";
    break;
  case CMP0052:
    pcStack_10 = "3.1.0";
    break;
  case CMP0053:
    pcStack_10 = "3.1.0";
    break;
  case CMP0054:
    pcStack_10 = "3.1.0";
    break;
  case CMP0055:
    pcStack_10 = "3.2.0";
    break;
  case CMP0056:
    pcStack_10 = "3.2.0";
    break;
  case CMP0057:
    pcStack_10 = "3.3.0";
    break;
  case CMP0058:
    pcStack_10 = "3.3.0";
    break;
  case CMP0059:
    pcStack_10 = "3.3.0";
    break;
  case CMP0060:
    pcStack_10 = "3.3.0";
    break;
  case CMP0061:
    pcStack_10 = "3.3.0";
    break;
  case CMP0062:
    pcStack_10 = "3.3.0";
    break;
  case CMP0063:
    pcStack_10 = "3.3.0";
    break;
  case CMP0064:
    pcStack_10 = "3.4.0";
    break;
  case CMP0065:
    pcStack_10 = "3.4.0";
    break;
  case CMPCOUNT:
    pcStack_10 = (char *)0x0;
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* idToVersion(cmPolicies::PolicyID id)
{
  switch(id)
    {
#define POLICY_CASE(ID, V_MAJOR, V_MINOR, V_PATCH) \
    case cmPolicies::ID: \
      return #V_MAJOR "." #V_MINOR "." #V_PATCH;
  CM_FOR_EACH_POLICY_ID_VERSION(POLICY_CASE)
#undef POLICY_CASE
    case cmPolicies::CMPCOUNT:
      return 0;
    }
  return 0;
}